

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O1

ze_result_t
driver::zeDriverRTASFormatCompatibilityCheckExt
          (ze_driver_handle_t hDriver,ze_rtas_format_ext_t rtasFormatA,
          ze_rtas_format_ext_t rtasFormatB)

{
  ze_result_t zVar1;
  
  if (DAT_0010e1a8 != (code *)0x0) {
    zVar1 = (*DAT_0010e1a8)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeDriverRTASFormatCompatibilityCheckExt(
        ze_driver_handle_t hDriver,                     ///< [in] handle of driver object
        ze_rtas_format_ext_t rtasFormatA,               ///< [in] operand A
        ze_rtas_format_ext_t rtasFormatB                ///< [in] operand B
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnRTASFormatCompatibilityCheckExt = context.zeDdiTable.Driver.pfnRTASFormatCompatibilityCheckExt;
        if( nullptr != pfnRTASFormatCompatibilityCheckExt )
        {
            result = pfnRTASFormatCompatibilityCheckExt( hDriver, rtasFormatA, rtasFormatB );
        }
        else
        {
            // generic implementation
        }

        return result;
    }